

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

void __thiscall OpenMD::StuntDouble::setA(StuntDouble *this,RotMat3x3d *a,int snapshotNo)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->snapshotMan_->_vptr_SnapshotManager[4])
                    (this->snapshotMan_,(ulong)(uint)snapshotNo);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)
             ((long)this->localIndex_ * 0x48 +
             *(long *)(CONCAT44(extraout_var,iVar1) + 0x48 + this->storage_)),
             (RectMatrix<double,_3U,_3U> *)a);
  return;
}

Assistant:

virtual void setA(const RotMat3x3d& a, int snapshotNo) {
      ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] =
          a;
    }